

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::HeapProfile(Benchmark *this)

{
  char *pcVar1;
  long *plVar2;
  FILE *__stream;
  allocator local_b1;
  Status s;
  string local_a8;
  Status local_88;
  WritableFile *file;
  char fname [100];
  
  pcVar1 = FLAGS_db;
  this->heap_counter_ = this->heap_counter_ + 1;
  snprintf(fname,100,"%s/heap-%04d",pcVar1);
  plVar2 = (anonymous_namespace)::g_env;
  std::__cxx11::string::string((string *)&local_a8,fname,&local_b1);
  (**(code **)(*plVar2 + 0x20))(&s,plVar2,&local_a8,&file);
  std::__cxx11::string::~string((string *)&local_a8);
  __stream = _stderr;
  if (s.state_ == (char *)0x0) {
    if (file != (WritableFile *)0x0) {
      (*file->_vptr_WritableFile[1])();
    }
    fwrite("heap profiling not supported\n",0x1d,1,_stderr);
    plVar2 = (anonymous_namespace)::g_env;
    std::__cxx11::string::string((string *)&local_a8,fname,&local_b1);
    (**(code **)(*plVar2 + 0x40))(&local_88,plVar2,&local_a8);
    Status::~Status(&local_88);
  }
  else {
    Status::ToString_abi_cxx11_(&local_a8,&s);
    fprintf(__stream,"%s\n",local_a8._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  Status::~Status(&s);
  return;
}

Assistant:

void HeapProfile() {
    char fname[100];
    snprintf(fname, sizeof(fname), "%s/heap-%04d", FLAGS_db, ++heap_counter_);
    WritableFile* file;
    Status s = g_env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      fprintf(stderr, "%s\n", s.ToString().c_str());
      return;
    }
    bool ok = port::GetHeapProfile(WriteToFile, file);
    delete file;
    if (!ok) {
      fprintf(stderr, "heap profiling not supported\n");
      g_env->DeleteFile(fname);
    }
  }